

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib643.c
# Opt level: O3

size_t read_callback(char *ptr,size_t size,size_t nmemb,void *userp)

{
  if (**userp == '\0' || size * nmemb == 0) {
    return 0;
  }
  *ptr = **userp;
  *(long *)userp = *userp + 1;
  return 1;
}

Assistant:

static size_t read_callback(char *ptr, size_t size, size_t nmemb, void *userp)
{
#ifdef LIB644
  static int count = 0;
  (void)ptr;
  (void)size;
  (void)nmemb;
  (void)userp;
  switch(count++) {
  case 0: /* Return a single byte. */
    *ptr = '\n';
    return 1;
  case 1: /* Request abort. */
    return CURL_READFUNC_ABORT;
  }
  printf("Wrongly called >2 times\n");
  exit(1); /* trigger major failure */
#else

  struct WriteThis *pooh = (struct WriteThis *)userp;
  int eof = !*pooh->readptr;

  if(size*nmemb < 1)
    return 0;

#ifndef LIB645
  eof = pooh->sizeleft <= 0;
  if(!eof)
    pooh->sizeleft--;
#endif

  if(!eof) {
    *ptr = *pooh->readptr;           /* copy one single byte */
    pooh->readptr++;                 /* advance pointer */
    return 1;                        /* we return 1 byte at a time! */
  }

  return 0;                         /* no more data left to deliver */
#endif
}